

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalNinjaGenerator::CheckCxxModuleSupport(cmGlobalNinjaGenerator *this)

{
  element_type *peVar1;
  cmake *pcVar2;
  bool bVar3;
  ostream *poVar4;
  ostringstream e;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  if ((this->DiagnosedCxxModuleSupport != false) ||
     (bVar3 = cmake::GetIsInTryCompile
                        ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                        ), bVar3)) {
    return this->NinjaSupportsDyndeps;
  }
  this->DiagnosedCxxModuleSupport = true;
  pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  local_190._0_8_ = local_190 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,
             "C++20 modules support via CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP is experimental.  It is meant only for compiler developers to try."
             ,"");
  local_1c8._0_8_ = (element_type *)0x0;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1c8);
  cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_190,(cmListFileBacktrace *)local_1c8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (this->NinjaSupportsDyndeps != false) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "The Ninja generator does not support C++20 modules using Ninja version \n  ",0x4a);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->NinjaVersion)._M_dataplus._M_p,
                      (this->NinjaVersion)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\ndue to lack of required features.  Ninja ",0x2a);
  peVar1 = (element_type *)(local_1c8 + 0x10);
  local_1c8._16_4_ = 0x30312e31;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
  local_1c8._20_4_ = local_1c8._20_4_ & 0xffffff00;
  local_1c8._0_8_ = peVar1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)peVar1,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," or higher is required.",0x17);
  if ((element_type *)local_1c8._0_8_ != peVar1) {
    operator_delete((void *)local_1c8._0_8_,CONCAT44(local_1c8._20_4_,local_1c8._16_4_) + 1);
  }
  pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  std::__cxx11::stringbuf::str();
  local_1a8._M_allocated_capacity = 0;
  local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1a8);
  cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1c8,(cmListFileBacktrace *)&local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if ((element_type *)local_1c8._0_8_ != peVar1) {
    operator_delete((void *)local_1c8._0_8_,CONCAT44(local_1c8._20_4_,local_1c8._16_4_) + 1);
  }
  cmSystemTools::s_FatalErrorOccurred = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return false;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckCxxModuleSupport()
{
  bool const diagnose = !this->DiagnosedCxxModuleSupport &&
    !this->CMakeInstance->GetIsInTryCompile();
  if (diagnose) {
    this->DiagnosedCxxModuleSupport = true;
    this->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "C++20 modules support via CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP "
      "is experimental.  It is meant only for compiler developers to try.");
  }
  if (this->NinjaSupportsDyndeps) {
    return true;
  }
  if (diagnose) {
    std::ostringstream e;
    /* clang-format off */
    e <<
      "The Ninja generator does not support C++20 modules "
      "using Ninja version \n"
      "  " << this->NinjaVersion << "\n"
      "due to lack of required features.  "
      "Ninja " << RequiredNinjaVersionForDyndeps() << " or higher is required."
      ;
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
  }
  return false;
}